

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_ptr_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id,
          bool register_expression_read)

{
  Variant *pVVar1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  SPIRExpression *pSVar5;
  string local_40;
  
  uVar4 = (ulong)id;
  if ((uVar4 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar4].type == TypeExpression)) {
    pSVar5 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar4);
    if (pSVar5->need_transpose == true) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      pcVar2 = (pSVar5->expression)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar2,pcVar2 + (pSVar5->expression)._M_string_length);
      goto LAB_002a5b08;
    }
  }
  CompilerGLSL::to_expression_abi_cxx11_
            (&local_40,&this->super_CompilerGLSL,id,register_expression_read);
LAB_002a5b08:
  CompilerGLSL::enclose_expression(__return_storage_ptr__,&this->super_CompilerGLSL,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  bVar3 = CompilerGLSL::should_dereference(&this->super_CompilerGLSL,id);
  if (!bVar3) {
    CompilerGLSL::address_of_expression(&local_40,&this->super_CompilerGLSL,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_ptr_expression(uint32_t id, bool register_expression_read)
{
	auto *e = maybe_get<SPIRExpression>(id);
	auto expr = enclose_expression(e && e->need_transpose ? e->expression : to_expression(id, register_expression_read));
	if (!should_dereference(id))
		expr = address_of_expression(expr);
	return expr;
}